

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O0

Am_Text_Style_Run * __thiscall
Am_Rich_Text_Data::Get_Style_Run_At
          (Am_Rich_Text_Data *this,Am_Text_Index inIndex,Am_Text_Length *outRemChars)

{
  unsigned_long uVar1;
  Am_Text_Style_Run *local_30;
  Am_Text_Style_Run *sr;
  Am_Text_Index lastCharInRun;
  Am_Text_Length *outRemChars_local;
  Am_Text_Index inIndex_local;
  Am_Rich_Text_Data *this_local;
  
  sr = (Am_Text_Style_Run *)0x0;
  local_30 = this->mHeadStyle;
  *outRemChars = 0;
  while( true ) {
    if (local_30 == (Am_Text_Style_Run *)0x0) {
      return (Am_Text_Style_Run *)0x0;
    }
    uVar1 = Am_Text_Style_Run::Length(local_30);
    sr = (Am_Text_Style_Run *)((long)&sr->mCharsInRun + uVar1);
    if (inIndex <= sr) break;
    local_30 = Am_Text_Style_Run::Next(local_30);
  }
  uVar1 = Am_Text_Style_Run::Length(local_30);
  *outRemChars = (uVar1 - (long)sr) + inIndex;
  return local_30;
}

Assistant:

Am_Text_Style_Run *
Am_Rich_Text_Data::Get_Style_Run_At(const Am_Text_Index inIndex,
                                    Am_Text_Length &outRemChars) const
{
  Am_Text_Index lastCharInRun = 0;
  Am_Text_Style_Run *sr = mHeadStyle;
  outRemChars = 0; // just in case

  while (sr != nullptr) {
    lastCharInRun += sr->Length();
    if (inIndex <= lastCharInRun) {
      // find the relative index
      outRemChars = sr->Length() - lastCharInRun + inIndex;
      break;
    }
    sr = sr->Next();
  }
  return sr;
}